

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,char *lineptr,char *domain,
                        char *path)

{
  char cVar1;
  char cVar2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  CURLofft CVar6;
  time_t tVar7;
  Cookie *co;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  time_t tVar12;
  long lVar13;
  curl_off_t *num;
  Cookie *pCVar14;
  Cookie *pCVar15;
  Cookie *pCVar16;
  uint uVar17;
  char *pcVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  char *local_2068;
  char name [4096];
  char what [4096];
  
  bVar21 = 0;
  tVar7 = time((time_t *)0x0);
  co = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (co == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    sVar8 = strlen(lineptr);
    if (5000 < sVar8) {
LAB_0010da5d:
      (*Curl_cfree)(co);
      return (Cookie *)0x0;
    }
    pcVar9 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    local_2068 = domain;
    bVar20 = false;
LAB_0010da80:
    what[0] = '\0';
    name._0_8_ = name._0_8_ & 0xffffffffffffff00;
    iVar5 = __isoc99_sscanf(lineptr,"%4095[^;\r\n=] =%4095[^;\r\n]",name,what);
    if (iVar5 < 1) {
LAB_0010de33:
      bVar19 = bVar20;
      if ((pcVar9 == (char *)0x0) || (lineptr = pcVar9, *pcVar9 == '\0')) goto LAB_0010e105;
      do {
        do {
          lineptr = lineptr + 1;
          cVar1 = *lineptr;
        } while (cVar1 == ' ');
      } while (cVar1 == '\t');
      pcVar9 = strchr(lineptr,0x3b);
      bVar20 = bVar19;
      if (pcVar9 == (char *)0x0) {
        if (cVar1 == '\0') goto LAB_0010e105;
        sVar8 = strlen(lineptr);
        pcVar9 = lineptr + sVar8;
      }
      goto LAB_0010da80;
    }
    sVar10 = strlen(what);
    sVar8 = strlen(name);
    if (((0xffe < sVar8) || (0xffe < sVar10)) || (0x1000 < sVar10 + sVar8)) {
      freecookie(co);
      Curl_infof(data,"oversized cookie dropped, name/val %d + %d bytes\n",sVar8,sVar10);
      return (Cookie *)0x0;
    }
    cVar1 = lineptr[sVar8];
    if ((sVar8 != 0) && ((cVar2 = lineptr[sVar8 - 1], cVar2 == ' ' || (cVar2 == '\t'))))
    goto LAB_0010db0e;
    while( true ) {
      pcVar18 = what;
      if (sVar10 == 0) break;
      pcVar11 = name + sVar10 + 0xfff;
      sVar8 = sVar10 - 1;
      if ((*pcVar11 != '\t') && (*pcVar11 != ' ')) break;
LAB_0010db80:
      sVar10 = sVar8;
      *pcVar11 = '\0';
    }
    for (; (*pcVar18 == ' ' || (*pcVar18 == '\t')); pcVar18 = pcVar18 + 1) {
    }
    if ((co->name == (char *)0x0) && (cVar1 == '=')) {
      pcVar11 = (*Curl_cstrdup)(name);
      co->name = pcVar11;
      pcVar11 = (*Curl_cstrdup)(pcVar18);
      co->value = pcVar11;
      bVar19 = true;
      if ((co->name == (char *)0x0) || (pcVar11 == (char *)0x0)) goto LAB_0010e105;
    }
    else if (sVar10 == 0) {
      iVar5 = Curl_strcasecompare("secure",name);
      if (iVar5 == 0) {
        iVar5 = Curl_strcasecompare("httponly",name);
        if (iVar5 == 0) {
          if (cVar1 == '=') goto LAB_0010dbde;
        }
        else {
          co->httponly = true;
        }
      }
      else {
        co->secure = true;
      }
      goto LAB_0010de33;
    }
LAB_0010dbde:
    iVar5 = Curl_strcasecompare("path",name);
    if (iVar5 != 0) {
      (*Curl_cfree)(co->path);
      pcVar11 = (*Curl_cstrdup)(pcVar18);
      co->path = pcVar11;
      bVar19 = true;
      if (pcVar11 == (char *)0x0) goto LAB_0010e105;
      (*Curl_cfree)(co->spath);
      pcVar11 = sanitize_cookie_path(co->path);
      co->spath = pcVar11;
      if (pcVar11 == (char *)0x0) goto LAB_0010e105;
      goto LAB_0010de33;
    }
    iVar5 = Curl_strcasecompare("domain",name);
    if (iVar5 == 0) {
      iVar5 = Curl_strcasecompare("version",name);
      if (iVar5 != 0) {
        (*Curl_cfree)(co->version);
        pcVar11 = (*Curl_cstrdup)(pcVar18);
        co->version = pcVar11;
        goto LAB_0010dda8;
      }
      iVar5 = Curl_strcasecompare("max-age",name);
      if (iVar5 == 0) {
        iVar5 = Curl_strcasecompare("expires",name);
        if (iVar5 != 0) {
          (*Curl_cfree)(co->expirestr);
          pcVar11 = (*Curl_cstrdup)(pcVar18);
          co->expirestr = pcVar11;
          goto LAB_0010dda8;
        }
      }
      else {
        (*Curl_cfree)(co->maxage);
        pcVar11 = (*Curl_cstrdup)(pcVar18);
        co->maxage = pcVar11;
        if (pcVar11 == (char *)0x0) {
          bVar19 = true;
          goto LAB_0010e1a5;
        }
      }
      goto LAB_0010de33;
    }
    pcVar18 = pcVar18 + (*pcVar18 == '.');
    pcVar11 = strchr(pcVar18,0x2e);
    if ((pcVar11 == (char *)0x0) && (iVar5 = Curl_strcasecompare("localhost",pcVar18), iVar5 == 0))
    {
      local_2068 = ":";
    }
    pcVar11 = local_2068;
    if (local_2068 == (char *)0x0) {
      pcVar11 = pcVar18;
    }
    _Var3 = isip(pcVar11);
    if (local_2068 != (char *)0x0) {
      if (_Var3) {
        iVar5 = strcmp(pcVar18,local_2068);
        if (iVar5 != 0) {
LAB_0010dd2d:
          Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar18);
          bVar20 = true;
          goto LAB_0010de33;
        }
      }
      else {
        _Var4 = tailmatch(pcVar18,local_2068);
        if (!_Var4) goto LAB_0010dd2d;
      }
    }
    (*Curl_cfree)(co->domain);
    pcVar11 = (*Curl_cstrdup)(pcVar18);
    co->domain = pcVar11;
    if (pcVar11 != (char *)0x0 && !_Var3) {
      co->tailmatch = true;
      goto LAB_0010de33;
    }
LAB_0010dda8:
    if (pcVar11 != (char *)0x0) goto LAB_0010de33;
    bVar19 = true;
LAB_0010e105:
    pcVar9 = co->maxage;
    if (pcVar9 == (char *)0x0) {
LAB_0010e1a5:
      if (co->expirestr != (char *)0x0) {
        tVar12 = curl_getdate(co->expirestr,(time_t *)0x0);
        co->expires = tVar12;
        if (tVar12 == 0) {
          co->expires = 1;
        }
        else if (tVar12 < 0) {
          co->expires = 0;
        }
      }
    }
    else {
      num = &co->expires;
      CVar6 = curlx_strtoofft(pcVar9 + (*pcVar9 == '\"'),(char **)0x0,10,num);
      if (CVar6 == CURL_OFFT_OK) {
        if (0x7fffffffffffffff - tVar7 < *num) goto LAB_0010e162;
        *num = *num + tVar7;
      }
      else if (CVar6 == CURL_OFFT_FLOW) {
LAB_0010e162:
        *num = 0x7fffffffffffffff;
      }
    }
    bVar20 = bVar19;
    if (((!bVar19) && (co->domain == (char *)0x0)) && (local_2068 != (char *)0x0)) {
      pcVar9 = (*Curl_cstrdup)(local_2068);
      co->domain = pcVar9;
      bVar20 = true;
      if (pcVar9 != (char *)0x0) {
        bVar20 = bVar19;
      }
    }
    if (((!bVar20) && (path != (char *)0x0)) && (co->path == (char *)0x0)) {
      pcVar9 = strchr(path,0x3f);
      if (pcVar9 == (char *)0x0) {
        pcVar9 = strrchr(path,0x2f);
      }
      else {
        pcVar9 = (char *)Curl_memrchr(path,0x2f,(long)pcVar9 - (long)path);
      }
      if (pcVar9 != (char *)0x0) {
        pcVar11 = (char *)(*Curl_cmalloc)((size_t)(pcVar9 + (2 - (long)path)));
        co->path = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_0010e474;
        memcpy(pcVar11,path,(size_t)(pcVar9 + (1 - (long)path)));
        co->path[(long)(pcVar9 + (1 - (long)path))] = '\0';
        pcVar9 = sanitize_cookie_path(co->path);
        co->spath = pcVar9;
        bVar20 = pcVar9 == (char *)0x0;
      }
    }
    if ((bVar20) || (co->name == (char *)0x0)) goto LAB_0010e474;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar5 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar5 == 0) {
      lineptr = lineptr + 10;
      co->httponly = true;
    }
    if (*lineptr == '#') goto LAB_0010da5d;
    pcVar9 = strchr(lineptr,0xd);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = '\0';
    }
    pcVar9 = strchr(lineptr,10);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = '\0';
    }
    pcVar9 = strtok_r(lineptr,"\t",(char **)name);
    bVar20 = false;
    uVar17 = 0;
    while ((pcVar9 != (char *)0x0 && (!bVar20))) {
      switch(uVar17) {
      case 0:
        pcVar9 = (*Curl_cstrdup)(pcVar9 + (*pcVar9 == '.'));
        co->domain = pcVar9;
        if (pcVar9 == (char *)0x0) {
          bVar20 = true;
        }
        uVar17 = 0;
        break;
      case 1:
        iVar5 = Curl_strcasecompare(pcVar9,"TRUE");
        co->tailmatch = iVar5 != 0;
        uVar17 = 1;
        break;
      case 2:
        iVar5 = strcmp("TRUE",pcVar9);
        if ((iVar5 == 0) || (iVar5 = strcmp("FALSE",pcVar9), iVar5 == 0)) {
          pcVar11 = (*Curl_cstrdup)("/");
          co->path = pcVar11;
          pcVar18 = (*Curl_cstrdup)("/");
          co->spath = pcVar18;
          if (pcVar11 == (char *)0x0) {
            bVar20 = true;
          }
          if (pcVar18 == (char *)0x0) {
            bVar20 = true;
          }
          goto switchD_0010df19_caseD_3;
        }
        pcVar9 = (*Curl_cstrdup)(pcVar9);
        co->path = pcVar9;
        if (pcVar9 == (char *)0x0) {
          bVar20 = true;
        }
        else {
          pcVar9 = sanitize_cookie_path(pcVar9);
          co->spath = pcVar9;
          if (pcVar9 == (char *)0x0) {
            bVar20 = true;
          }
        }
        uVar17 = 2;
        break;
      case 3:
switchD_0010df19_caseD_3:
        iVar5 = Curl_strcasecompare(pcVar9,"TRUE");
        co->secure = iVar5 != 0;
        uVar17 = 3;
        break;
      case 4:
        CVar6 = curlx_strtoofft(pcVar9,(char **)0x0,10,&co->expires);
        if (CVar6 != CURL_OFFT_OK) {
          bVar20 = true;
        }
        uVar17 = 4;
        break;
      case 5:
        pcVar9 = (*Curl_cstrdup)(pcVar9);
        co->name = pcVar9;
        if (pcVar9 == (char *)0x0) {
          bVar20 = true;
        }
        uVar17 = 5;
        break;
      case 6:
        pcVar9 = (*Curl_cstrdup)(pcVar9);
        co->value = pcVar9;
        if (pcVar9 == (char *)0x0) {
          bVar20 = true;
        }
        uVar17 = 6;
      }
      pcVar9 = strtok_r((char *)0x0,"\t",(char **)name);
      uVar17 = uVar17 + 1;
    }
    if (uVar17 == 6) {
      pcVar9 = (*Curl_cstrdup)("");
      co->value = pcVar9;
      if (pcVar9 == (char *)0x0) {
        bVar20 = true;
      }
      uVar17 = pcVar9 == (char *)0x0 ^ 7;
    }
    if ((bVar20) || (uVar17 != 7)) goto LAB_0010e474;
  }
  if ((c->running != false) || ((c->newsession != true || (co->expires != 0)))) {
    co->livecookie = c->running;
    remove_expired(c);
    bVar20 = false;
    pCVar14 = (Cookie *)c;
    pCVar15 = (Cookie *)0x0;
LAB_0010e25a:
    do {
      do {
        do {
          pCVar14 = pCVar14->next;
          if (pCVar14 == (Cookie *)0x0) goto LAB_0010e369;
          iVar5 = Curl_strcasecompare(pCVar14->name,co->name);
          pCVar15 = pCVar14;
        } while (iVar5 == 0);
        pcVar9 = co->domain;
        if (pCVar14->domain == (char *)0x0) {
          bVar19 = pcVar9 == (char *)0x0;
LAB_0010e2a5:
          if (bVar19) {
            bVar20 = true;
          }
        }
        else if ((pcVar9 != (char *)0x0) &&
                (iVar5 = Curl_strcasecompare(pCVar14->domain,pcVar9), iVar5 != 0)) {
          bVar19 = pCVar14->tailmatch == co->tailmatch;
          goto LAB_0010e2a5;
        }
      } while (!bVar20);
      pcVar9 = co->spath;
      bVar20 = false;
      if (pCVar14->spath != (char *)0x0) {
        if (pcVar9 != (char *)0x0) {
          iVar5 = Curl_strcasecompare(pCVar14->spath,pcVar9);
          bVar20 = false;
          if (iVar5 != 0) break;
        }
        goto LAB_0010e25a;
      }
    } while (pcVar9 != (char *)0x0);
    if ((co->livecookie != false) || (pCVar14->livecookie != true)) {
      co->next = pCVar14->next;
      (*Curl_cfree)(pCVar14->name);
      (*Curl_cfree)(pCVar14->value);
      (*Curl_cfree)(pCVar14->domain);
      (*Curl_cfree)(pCVar14->path);
      (*Curl_cfree)(pCVar14->spath);
      (*Curl_cfree)(pCVar14->expirestr);
      (*Curl_cfree)(pCVar14->version);
      (*Curl_cfree)(pCVar14->maxage);
      pCVar15 = co;
      pCVar16 = pCVar14;
      for (lVar13 = 0xc; lVar13 != 0; lVar13 = lVar13 + -1) {
        pCVar16->next = pCVar15->next;
        pCVar15 = (Cookie *)((long)pCVar15 + (ulong)bVar21 * -0x10 + 8);
        pCVar16 = (Cookie *)((long)pCVar16 + (ulong)bVar21 * -0x10 + 8);
      }
      (*Curl_cfree)(co);
      pCVar16 = pCVar14;
      do {
        pCVar15 = pCVar16;
        bVar20 = true;
        pCVar16 = pCVar15->next;
        co = pCVar14;
      } while (pCVar15->next != (Cookie *)0x0);
LAB_0010e369:
      if (c->running != false) {
        pcVar9 = "Added";
        if (bVar20) {
          pcVar9 = "Replaced";
        }
        Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar9,co->name,
                   co->value,co->domain,co->path,co->expires);
      }
      if (!bVar20) {
        if (pCVar15 == (Cookie *)0x0) {
          pCVar15 = (Cookie *)c;
        }
        pCVar15->next = co;
        c->numcookies = c->numcookies + 1;
        return co;
      }
      return co;
    }
  }
LAB_0010e474:
  freecookie(co);
  return (Cookie *)0x0;
LAB_0010db0e:
  if (cVar2 == ' ') {
    if (sVar8 == 0) {
      sVar8 = 0;
LAB_0010db48:
      pcVar11 = name + sVar8;
      sVar8 = sVar10;
      goto LAB_0010db80;
    }
  }
  else if (((cVar2 == '\0') || (cVar2 != '\t')) || (sVar8 == 0)) goto LAB_0010db48;
  cVar2 = lineptr[sVar8 - 2];
  sVar8 = sVar8 - 1;
  goto LAB_0010db0e;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path)   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
{
  struct Cookie *clist;
  struct Cookie *co;
  struct Cookie *lastc = NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */

#ifdef USE_LIBPSL
  const psl_ctx_t *psl;
#endif

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    char name[MAX_NAME];
    char what[MAX_NAME];
    const char *ptr;
    const char *semiptr;

    size_t linelength = strlen(lineptr);
    if(linelength > MAX_COOKIE_LINE) {
      /* discard overly long lines at once */
      free(co);
      return NULL;
    }

    semiptr = strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0] = what[0] = 0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_NAME_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len = strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        if(nlen >= (MAX_NAME-1) || len >= (MAX_NAME-1) ||
           ((nlen + len) > MAX_NAME)) {
          /* too long individual name or contents, or too long combination of
             name + contents. Chrome and Firefox support 4095 or 4096 bytes
             combo. */
          freecookie(co);
          infof(data, "oversized cookie dropped, name/val %d + %d bytes\n",
                nlen, len);
          return NULL;
        }

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen] = 0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1] = 0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr = what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name && sep) {
          /* The very first name/value pair is the actual cookie name */
          co->name = strdup(name);
          co->value = strdup(whatptr);
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          if(strcasecompare("secure", name))
            co->secure = TRUE;
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          free(co->spath); /* if this is set again */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          {
            const char *dotp;
            /* check for more dots */
            dotp = strchr(whatptr, '.');
            if(!dotp && !strcasecompare("localhost", whatptr))
              domain = ":";
          }
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch = TRUE; /* we always do that if the domain name was
                                       given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie = TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr = semiptr + 1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr = strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr = strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      CURLofft offt;
      offt = curlx_strtoofft((*co->maxage == '\"')?
                             &co->maxage[1]:&co->maxage[0], NULL, 10,
                             &co->expires);
      if(offt == CURL_OFFT_FLOW)
        /* overflow, used max value */
        co->expires = CURL_OFF_T_MAX;
      else if(!offt) {
        if(CURL_OFF_T_MAX - now < co->expires)
          /* would overflow */
          co->expires = CURL_OFF_T_MAX;
        else
          co->expires += now;
      }
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain = strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (size_t)(queryp - path));
      if(endslash) {
        size_t pathlen = (size_t)(endslash-path + 1); /* include end slash */
        co->path = malloc(pathlen + 1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen] = 0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf = NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr = strchr(lineptr, '\r');
    if(ptr)
      *ptr = 0; /* clear it */
    ptr = strchr(lineptr, '\n');
    if(ptr)
      *ptr = 0; /* clear it */

    firstptr = strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr = firstptr, fields = 0; ptr && !badcookie;
        ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 4:
        if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
          badcookie = TRUE;
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;

  /* now, we have parsed the incoming line, we must now check if this
     superceeds an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  remove_expired(c);

#ifdef USE_LIBPSL
  /* Check if the domain is a Public Suffix and if yes, ignore the cookie.
     This needs a libpsl compiled with builtin data. */
  if(domain && co->domain && !isip(co->domain)) {
    psl = psl_builtin();
    if(psl && !psl_is_cookie_domain_acceptable(psl, domain, co->domain)) {
      infof(data,
            "cookie '%s' dropped, domain '%s' must not set cookies for '%s'\n",
            co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }
#endif

  clist = c->cookies;
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(strcasecompare(clist->spath, co->spath)) {
            replace_old = TRUE;
          }
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}